

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_copy_n(STRING_HANDLE handle,char *s2,size_t n)

{
  char *pcVar1;
  LOGGER_LOG p_Var2;
  char *local_58;
  LOGGER_LOG l;
  size_t realloc_size;
  char *temp;
  size_t s2Length;
  STRING *s1;
  int result;
  size_t n_local;
  char *s2_local;
  STRING_HANDLE handle_local;
  
  if ((handle == (STRING_HANDLE)0x0) || (s2 == (char *)0x0)) {
    s1._4_4_ = 0x20e;
  }
  else {
    temp = (char *)strlen(s2);
    if (n < temp) {
      temp = (char *)n;
    }
    if (temp < (char *)0xfffffffffffffffe) {
      local_58 = temp + 1;
    }
    else {
      local_58 = (char *)0xffffffffffffffff;
    }
    if ((local_58 == (char *)0xffffffffffffffff) ||
       (pcVar1 = (char *)realloc(handle->s,(size_t)local_58), pcVar1 == (char *)0x0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                  ,"STRING_copy_n",0x21e,1,"Failure reallocating value. size=%zu",local_58);
      }
      s1._4_4_ = 0x220;
    }
    else {
      handle->s = pcVar1;
      memcpy(handle->s,s2,(size_t)temp);
      handle->s[(long)temp] = '\0';
      s1._4_4_ = 0;
    }
  }
  return s1._4_4_;
}

Assistant:

int STRING_copy_n(STRING_HANDLE handle, const char* s2, size_t n)
{
    int result;
    if ((handle == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_019: [STRING_copy_n shall return a nonzero value if STRING_HANDLE or const char* is NULL.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        size_t s2Length = strlen(s2);
        char* temp;
        if (s2Length > n)
        {
            s2Length = n;
        }

        size_t realloc_size = safe_add_size_t(s2Length, 1);
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
        {
            LogError("Failure reallocating value. size=%zu", realloc_size);
            /* Codes_SRS_STRING_07_028: [STRING_copy_n shall return a nonzero value if any error is encountered.] */
            result = MU_FAILURE;
        }
        else
        {
            s1->s = temp;
            (void)memcpy(s1->s, s2, s2Length);
            s1->s[s2Length] = 0;
            result = 0;
        }

    }
    return result;
}